

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall vmips::address::output(address *this,ostream *out)

{
  Status SVar1;
  ostream *poVar2;
  
  SVar1 = ((this->data).super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->status;
  poVar2 = std::operator<<(out,"li ");
  operator<<(poVar2,(this->super_Unary).target.
                    super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar2 = std::operator<<(poVar2,", ");
  if (SVar1 == Undetermined) {
    std::operator<<(poVar2,"<stack_offset>");
    return;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return;
}

Assistant:

void address::output(std::ostream &out) const {
    if (data->status != MemoryLocation::Undetermined) {
        out << "li " << *this->target << ", " << data->offset;
    } else {
        out << "li " << *this->target << ", " << "<stack_offset>";
    }
}